

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O1

void __thiscall compute_boundary_test_1::test_method(compute_boundary_test_1 *this)

{
  void *pvVar1;
  long lVar2;
  double *pdVar3;
  iterator pdVar4;
  size_t sVar5;
  size_t cell;
  byte bVar6;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  initializer_list<unsigned_long> __l_17;
  initializer_list<unsigned_long> __l_18;
  initializer_list<unsigned_long> __l_19;
  initializer_list<unsigned_long> __l_20;
  initializer_list<unsigned_long> __l_21;
  initializer_list<unsigned_long> __l_22;
  initializer_list<unsigned_long> __l_23;
  initializer_list<unsigned_long> __l_24;
  initializer_list<unsigned_long> __l_25;
  initializer_list<unsigned_long> __l_26;
  initializer_list<unsigned_long> __l_27;
  initializer_list<unsigned_long> __l_28;
  initializer_list<unsigned_long> __l_29;
  initializer_list<unsigned_long> __l_30;
  initializer_list<unsigned_long> __l_31;
  initializer_list<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __l_32;
  initializer_list<double> __l_33;
  initializer_list<unsigned_int> __l_34;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  boundaries;
  Bitmap_cubical_complex increasing;
  allocator_type local_7fa;
  allocator_type local_7f9;
  allocator_type local_7f8;
  allocator_type local_7f7;
  allocator_type local_7f6;
  allocator_type local_7f5;
  allocator_type local_7f4;
  allocator_type local_7f3;
  allocator_type local_7f2;
  allocator_type local_7f1;
  allocator_type local_7f0;
  allocator_type local_7ef;
  allocator_type local_7ee;
  allocator_type local_7ed;
  allocator_type local_7ec;
  allocator_type local_7eb;
  allocator_type local_7ea;
  allocator_type local_7e9;
  allocator_type local_7e8;
  allocator_type local_7e7;
  allocator_type local_7e6;
  allocator_type local_7e5;
  allocator_type local_7e4;
  allocator_type local_7e3;
  allocator_type local_7e2;
  allocator_type local_7e1;
  allocator_type local_7e0;
  allocator_type local_7df;
  allocator_type local_7de;
  allocator_type local_7dd;
  allocator_type local_7dc;
  allocator_type local_7db;
  allocator_type local_7da;
  allocator_type local_7d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_7d8;
  undefined8 uStack_7c0;
  undefined **local_7b8;
  ulong uStack_7b0;
  undefined8 *local_7a8;
  char **ppcStack_7a0;
  size_t local_790;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_788;
  undefined8 uStack_770;
  vector<double,_std::allocator<double>_> local_768;
  undefined8 uStack_750;
  unsigned_long local_748 [2];
  shared_count local_738;
  undefined8 uStack_730;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_6f0;
  char *local_6d8;
  char *pcStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  unsigned_long local_6b8 [48];
  undefined1 local_538 [144];
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_490;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_478;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_460;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_448;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_430;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_418;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_400;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3d0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a0;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_370;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_340;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_328;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_310;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_280;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  unsigned_long local_98 [13];
  
  bVar6 = 0;
  local_538._16_8_ = (pointer)0x0;
  local_538._0_8_ = (_func_int **)0x0;
  local_538._8_8_ = (pointer)0x0;
  local_6b8[0x2e] = 0;
  local_6b8[0x2f] = 2;
  __l._M_len = 2;
  __l._M_array = local_6b8 + 0x2e;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_538 + 0x18),__l,
             &local_7d9);
  local_538._48_8_ = (pointer)0x0;
  local_538._56_8_ = (pointer)0x0;
  local_538._64_8_ = (pointer)0x0;
  local_6b8[0x2c] = 2;
  local_6b8[0x2d] = 4;
  __l_00._M_len = 2;
  __l_00._M_array = local_6b8 + 0x2c;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_538 + 0x48),__l_00,
             &local_7da);
  local_538._96_8_ = (pointer)0x0;
  local_538._104_8_ = (pointer)0x0;
  local_538._112_8_ = (pointer)0x0;
  local_6b8[0x2a] = 4;
  local_6b8[0x2b] = 6;
  __l_01._M_len = 2;
  __l_01._M_array = local_6b8 + 0x2a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_538 + 0x78),__l_01,
             &local_7db);
  local_4a8 = 0;
  uStack_4a0 = 0;
  local_498 = 0;
  local_6b8[0x28] = 0;
  local_6b8[0x29] = 0xe;
  __l_02._M_len = 2;
  __l_02._M_array = local_6b8 + 0x28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_490,__l_02,&local_7dc);
  local_7a8 = (undefined8 *)0x9;
  ppcStack_7a0 = (char **)0x7;
  local_7b8 = (undefined **)0x1;
  uStack_7b0 = 0xf;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_7b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_478,__l_03,&local_7dd);
  local_6b8[0x26] = 2;
  local_6b8[0x27] = 0x10;
  __l_04._M_len = 2;
  __l_04._M_array = local_6b8 + 0x26;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_460,__l_04,&local_7de);
  local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xb;
  uStack_750 = 9;
  local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3;
  local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x11;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&local_768;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_448,__l_05,&local_7df);
  local_6b8[0x24] = 4;
  local_6b8[0x25] = 0x12;
  __l_06._M_len = 2;
  __l_06._M_array = local_6b8 + 0x24;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_430,__l_06,&local_7e0);
  local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xd;
  uStack_770 = 0xb;
  local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x5;
  local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x13;
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_788;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_418,__l_07,&local_7e1);
  local_6b8[0x22] = 6;
  local_6b8[0x23] = 0x14;
  __l_08._M_len = 2;
  __l_08._M_array = local_6b8 + 0x22;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_400,__l_08,&local_7e2);
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3d8 = 0;
  local_6b8[0x20] = 0xe;
  local_6b8[0x21] = 0x10;
  __l_09._M_len = 2;
  __l_09._M_array = local_6b8 + 0x20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3d0,__l_09,&local_7e3);
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_3a8 = 0;
  local_6b8[0x1e] = 0x10;
  local_6b8[0x1f] = 0x12;
  __l_10._M_len = 2;
  __l_10._M_array = local_6b8 + 0x1e;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3a0,__l_10,&local_7e4);
  local_388 = 0;
  uStack_380 = 0;
  local_378 = 0;
  local_6b8[0x1c] = 0x12;
  local_6b8[0x1d] = 0x14;
  __l_11._M_len = 2;
  __l_11._M_array = local_6b8 + 0x1c;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_370,__l_11,&local_7e5);
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  local_6b8[0x1a] = 0xe;
  local_6b8[0x1b] = 0x1c;
  __l_12._M_len = 2;
  __l_12._M_array = local_6b8 + 0x1a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_340,__l_12,&local_7e6);
  local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x17;
  uStack_7c0 = 0x15;
  local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf;
  local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1d;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_7d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_328,__l_13,&local_7e7);
  local_6b8[0x18] = 0x10;
  local_6b8[0x19] = 0x1e;
  __l_14._M_len = 2;
  __l_14._M_array = local_6b8 + 0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_310,__l_14,&local_7e8);
  local_738.pi_ = (sp_counted_base *)0x19;
  uStack_730 = 0x17;
  local_748[0] = 0x11;
  local_748[1] = 0x1f;
  __l_15._M_len = 4;
  __l_15._M_array = local_748;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2f8,__l_15,&local_7e9);
  local_6b8[0x16] = 0x12;
  local_6b8[0x17] = 0x20;
  __l_16._M_len = 2;
  __l_16._M_array = local_6b8 + 0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2e0,__l_16,&local_7ea);
  local_6c8 = 0x1b;
  uStack_6c0 = 0x19;
  local_6d8 = (char *)0x13;
  pcStack_6d0 = (char *)0x21;
  __l_17._M_len = 4;
  __l_17._M_array = (iterator)&local_6d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2c8,__l_17,&local_7eb);
  local_6b8[0x14] = 0x14;
  local_6b8[0x15] = 0x22;
  __l_18._M_len = 2;
  __l_18._M_array = local_6b8 + 0x14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2b0,__l_18,&local_7ec);
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  local_6b8[0x12] = 0x1c;
  local_6b8[0x13] = 0x1e;
  __l_19._M_len = 2;
  __l_19._M_array = local_6b8 + 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_280,__l_19,&local_7ed);
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  local_6b8[0x10] = 0x1e;
  local_6b8[0x11] = 0x20;
  __l_20._M_len = 2;
  __l_20._M_array = local_6b8 + 0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_250,__l_20,&local_7ee);
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  local_6b8[0xe] = 0x20;
  local_6b8[0xf] = 0x22;
  __l_21._M_len = 2;
  __l_21._M_array = local_6b8 + 0xe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_220,__l_21,&local_7ef);
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  local_6b8[0xc] = 0x1c;
  local_6b8[0xd] = 0x2a;
  __l_22._M_len = 2;
  __l_22._M_array = local_6b8 + 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1f0,__l_22,&local_7f0);
  local_98[10] = 0x25;
  local_98[0xb] = 0x23;
  local_98[8] = 0x1d;
  local_98[9] = 0x2b;
  __l_23._M_len = 4;
  __l_23._M_array = local_98 + 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1d8,__l_23,&local_7f1);
  local_6b8[10] = 0x1e;
  local_6b8[0xb] = 0x2c;
  __l_24._M_len = 2;
  __l_24._M_array = local_6b8 + 10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1c0,__l_24,&local_7f2);
  local_98[6] = 0x27;
  local_98[7] = 0x25;
  local_98[4] = 0x1f;
  local_98[5] = 0x2d;
  __l_25._M_len = 4;
  __l_25._M_array = local_98 + 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1a8,__l_25,&local_7f3);
  local_6b8[8] = 0x20;
  local_6b8[9] = 0x2e;
  __l_26._M_len = 2;
  __l_26._M_array = local_6b8 + 8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_190,__l_26,&local_7f4);
  local_98[2] = 0x29;
  local_98[3] = 0x27;
  local_98[0] = 0x21;
  local_98[1] = 0x2f;
  __l_27._M_len = 4;
  __l_27._M_array = local_98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_178,__l_27,&local_7f5);
  local_6b8[6] = 0x22;
  local_6b8[7] = 0x30;
  __l_28._M_len = 2;
  __l_28._M_array = local_6b8 + 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_160,__l_28,&local_7f6);
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  local_6b8[4] = 0x2a;
  local_6b8[5] = 0x2c;
  __l_29._M_len = 2;
  __l_29._M_array = local_6b8 + 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_130,__l_29,&local_7f7);
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  local_6b8[2] = 0x2c;
  local_6b8[3] = 0x2e;
  __l_30._M_len = 2;
  __l_30._M_array = local_6b8 + 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_100,__l_30,&local_7f8);
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_6b8[0] = 0x2e;
  local_6b8[1] = 0x30;
  __l_31._M_len = 2;
  __l_31._M_array = local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,__l_31,&local_7f9);
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  __l_32._M_len = 0x31;
  __l_32._M_array = (iterator)local_538;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_6f0,__l_32,&local_7fa);
  lVar2 = 0x498;
  do {
    pvVar1 = *(void **)((long)local_6b8 + lVar2 + 0x168);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_6b8 + lVar2 + 0x178) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0);
  pdVar3 = (double *)&DAT_00124e28;
  pdVar4 = (iterator)local_538;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar6 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
  }
  __l_33._M_len = 9;
  __l_33._M_array = (iterator)local_538;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_768,__l_33,(allocator_type *)&local_7b8);
  local_538._0_8_ = (_func_int **)0x300000003;
  __l_34._M_len = 2;
  __l_34._M_array = (iterator)local_538;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_788,__l_34,(allocator_type *)&local_7b8);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )local_538,&local_788,&local_768,true);
  if (local_538._64_8_ != local_538._56_8_) {
    cell = 0;
    do {
      Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_boundary_of_a_cell
                (&local_7d8,(Bitmap_cubical_complex_base<double> *)local_538,cell);
      sVar5 = cell;
      if (local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar2 = 0;
        local_790 = cell;
        do {
          local_700 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
          ;
          local_6f8 = "";
          local_710 = &boost::unit_test::basic_cstring<char_const>::null;
          local_708 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_700,0x91,
                     &local_710);
          local_748[0] = CONCAT71(local_748[0]._1_7_,
                                  local_6f0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[cell].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar2] ==
                                  local_7d8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar2]);
          local_748[1] = 0;
          local_738.pi_ = (sp_counted_base *)0x0;
          local_6d8 = "boundaries[i][j] == bd[j]";
          pcStack_6d0 = "";
          uStack_7b0 = uStack_7b0 & 0xffffffffffffff00;
          local_7b8 = &PTR__lazy_ostream_0012bb78;
          local_7a8 = &boost::unit_test::lazy_ostream::inst;
          ppcStack_7a0 = &local_6d8;
          local_720 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
          ;
          local_718 = "";
          boost::test_tools::tt_detail::report_assertion(local_748,&local_7b8,&local_720,0x91,1,0,0)
          ;
          boost::detail::shared_count::~shared_count(&local_738);
          lVar2 = lVar2 + 1;
          sVar5 = local_790;
        } while (lVar2 != (long)local_7d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_7d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
      }
      if (local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_7d8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_7d8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cell = sVar5 + 1;
    } while (cell != (long)(local_538._64_8_ - local_538._56_8_) >> 3);
  }
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )local_538);
  if (local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_788.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_6f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_boundary_test_1) {
  std::vector<std::vector<size_t> > boundaries {
    {},
    {0, 2},
    {},
    {2, 4},
    {},
    {4, 6},
    {},
    {0, 14},
    {1, 15, 9, 7},
    {2, 16},
    {3, 17, 11, 9},
    {4, 18},
    {5, 19, 13, 11},
    {6, 20},
    {},
    {14, 16},
    {},
    {16, 18},
    {},
    {18, 20},
    {},
    {14, 28},
    {15, 29, 23, 21},
    {16, 30},
    {17, 31, 25, 23},
    {18, 32},
    {19, 33, 27, 25},
    {20, 34},
    {},
    {28, 30},
    {},
    {30, 32},
    {},
    {32, 34},
    {},
    {28, 42},
    {29, 43, 37, 35},
    {30, 44},
    {31, 45, 39, 37},
    {32, 46},
    {33, 47, 41, 39},
    {34, 48},
    {},
    {42, 44},
    {},
    {44, 46},
    {},
    {46, 48},
    {}
  };

  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);
  for (size_t i = 0; i != increasing.size(); ++i) {
    std::vector<size_t> bd = increasing.get_boundary_of_a_cell(i);
    for (size_t j = 0; j != bd.size(); ++j) {
      BOOST_CHECK(boundaries[i][j] == bd[j]);
    }
  }
}